

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O2

xmlParserInputBufferPtr
xmlParserInputBufferCreateIO
          (xmlInputReadCallback ioread,xmlInputCloseCallback ioclose,void *ioctx,xmlCharEncoding enc
          )

{
  xmlParserInputBufferPtr pxVar1;
  
  if (ioread != (xmlInputReadCallback)0x0) {
    pxVar1 = xmlAllocParserInputBuffer(enc);
    if (pxVar1 == (xmlParserInputBufferPtr)0x0) {
      pxVar1 = (xmlParserInputBufferPtr)0x0;
    }
    else {
      pxVar1->context = ioctx;
      pxVar1->readcallback = ioread;
      pxVar1->closecallback = ioclose;
    }
    return pxVar1;
  }
  return (xmlParserInputBufferPtr)0x0;
}

Assistant:

xmlParserInputBufferPtr
xmlParserInputBufferCreateIO(xmlInputReadCallback   ioread,
	 xmlInputCloseCallback  ioclose, void *ioctx, xmlCharEncoding enc) {
    xmlParserInputBufferPtr ret;

    if (ioread == NULL) return(NULL);

    ret = xmlAllocParserInputBuffer(enc);
    if (ret != NULL) {
        ret->context = (void *) ioctx;
	ret->readcallback = ioread;
	ret->closecallback = ioclose;
    }

    return(ret);
}